

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
::push_back(vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
            *this,LensElementInterface *value)

{
  LensElementInterface *in_RSI;
  polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface> *in_RDI;
  vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
  *unaff_retaddr;
  
  if (in_RDI[2].memoryResource == in_RDI[3].memoryResource) {
    reserve(unaff_retaddr,(size_t)in_RDI);
  }
  pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>::
  construct<pbrt::RealisticCamera::LensElementInterface,pbrt::RealisticCamera::LensElementInterface>
            (in_RDI,(LensElementInterface *)
                    (in_RDI[1].memoryResource + (long)in_RDI[3].memoryResource * 2),in_RSI);
  in_RDI[3].memoryResource =
       (memory_resource *)((long)&(in_RDI[3].memoryResource)->_vptr_memory_resource + 1);
  return;
}

Assistant:

void push_back(T &&value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::move(value));
        ++nStored;
    }